

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::GetBoundImage
          (GLContextState *this,Uint32 Index,GLuint *ImgHandle,GLint *MipLevel,GLboolean *IsLayered,
          GLint *Layer,GLenum *Access,GLenum *Format)

{
  size_type sVar1;
  const_reference pvVar2;
  BoundImageInfo *BoundImg;
  GLint *Layer_local;
  GLboolean *IsLayered_local;
  GLint *MipLevel_local;
  GLuint *ImgHandle_local;
  Uint32 Index_local;
  GLContextState *this_local;
  
  sVar1 = std::
          vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
          ::size(&this->m_BoundImages);
  if (Index < sVar1) {
    pvVar2 = std::
             vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             ::operator[](&this->m_BoundImages,(ulong)Index);
    *ImgHandle = pvVar2->GLHandle;
    *MipLevel = pvVar2->MipLevel;
    *IsLayered = pvVar2->IsLayered;
    *Layer = pvVar2->Layer;
    *Access = pvVar2->Access;
    *Format = pvVar2->Format;
  }
  else {
    *ImgHandle = 0;
    *MipLevel = 0;
    *IsLayered = '\0';
    *Layer = 0;
    *Access = 35000;
    *Format = 0x8814;
  }
  return;
}

Assistant:

void GLContextState::GetBoundImage(Uint32     Index,
                                   GLuint&    ImgHandle,
                                   GLint&     MipLevel,
                                   GLboolean& IsLayered,
                                   GLint&     Layer,
                                   GLenum&    Access,
                                   GLenum&    Format) const
{
    if (Index < m_BoundImages.size())
    {
        const BoundImageInfo& BoundImg = m_BoundImages[Index];

        ImgHandle = BoundImg.GLHandle;
        MipLevel  = BoundImg.MipLevel;
        IsLayered = BoundImg.IsLayered;
        Layer     = BoundImg.Layer;
        Access    = BoundImg.Access;
        Format    = BoundImg.Format;
    }
    else
    {
        ImgHandle = 0;
        MipLevel  = 0;
        IsLayered = GL_FALSE;
        Layer     = 0;
        Access    = GL_READ_ONLY;
        // Even though image handle is null, image format must still
        // be one of the supported formats, or glBindImageTexture
        // may fail on some GLES implementations.
        // GL_RGBA32F seems to be the safest choice.
        Format = GL_RGBA32F;
    }
}